

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_2_5::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
               (basic_ostream<char,_std::char_traits<char>_> *out,int v)

{
  undefined4 in_ESI;
  char b [4];
  char *in_stack_ffffffffffffffe8;
  
  writeSignedChars<(anonymous_namespace)::CharIO,std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)CONCAT44(in_ESI,in_ESI),
             in_stack_ffffffffffffffe8,0);
  return;
}

Assistant:

void
write (T &out, signed int v)
{
    signed char b[4];

    b[0] =  (signed char) (v);
    b[1] =  (signed char) (v >> 8);
    b[2] =  (signed char) (v >> 16);
    b[3] =  (signed char) (v >> 24);

    writeSignedChars<S> (out, b, 4);
}